

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_listener_controller.cpp
# Opt level: O2

void __thiscall
so_5::impl::state_listener_controller_t::changed
          (state_listener_controller_t *this,agent_t *agent,state_t *state)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  
  psVar1 = (this->m_listeners).
           super__Vector_base<std::shared_ptr<so_5::agent_state_listener_t>,_std::allocator<std::shared_ptr<so_5::agent_state_listener_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->m_listeners).
                super__Vector_base<std::shared_ptr<so_5::agent_state_listener_t>,_std::allocator<std::shared_ptr<so_5::agent_state_listener_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<so_5::agent_state_listener_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*peVar2->_vptr_agent_state_listener_t[2])(peVar2,agent,state);
  }
  return;
}

Assistant:

void
state_listener_controller_t::changed(
	agent_t & agent,
	const state_t & state )
{
	std::for_each(
		m_listeners.begin(),
		m_listeners.end(),
		[&agent, &state]( agent_state_listener_ref_t & listener ) {
			listener->changed( agent, state );
		} );
}